

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.hpp
# Opt level: O0

GraphicsPipelineBuilder * __thiscall
vkt::geometry::GraphicsPipelineBuilder::addVertexBinding
          (GraphicsPipelineBuilder *this,VkVertexInputBindingDescription vertexBinding)

{
  GraphicsPipelineBuilder *this_local;
  undefined1 local_14 [8];
  VkVertexInputBindingDescription vertexBinding_local;
  
  vertexBinding_local.binding = vertexBinding.inputRate;
  local_14 = vertexBinding._0_8_;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::push_back(&this->m_vertexInputBindings,(value_type *)local_14);
  return this;
}

Assistant:

GraphicsPipelineBuilder&	addVertexBinding				(const vk::VkVertexInputBindingDescription vertexBinding) { m_vertexInputBindings.push_back(vertexBinding); return *this; }